

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall
t_rs_generator::render_sync_client_definition_and_impl
          (t_rs_generator *this,string *client_impl_name)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  ostream *poVar3;
  string local_50;
  
  poVar1 = &this->f_gen_;
  poVar3 = std::operator<<((ostream *)poVar1,"pub struct ");
  poVar3 = std::operator<<(poVar3,(string *)client_impl_name);
  poVar3 = std::operator<<(poVar3,(string *)&SYNC_CLIENT_GENERIC_BOUND_VARS_abi_cxx11_);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,(string *)&SYNC_CLIENT_GENERIC_BOUNDS_abi_cxx11_);
  poVar3 = std::operator<<(poVar3," {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_50,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_50);
  poVar3 = std::operator<<(poVar3,"_i_prot: IP,");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  t_generator::indent_abi_cxx11_(&local_50,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_50);
  poVar3 = std::operator<<(poVar3,"_o_prot: OP,");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  t_generator::indent_abi_cxx11_(&local_50,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_50);
  poVar3 = std::operator<<(poVar3,"_sequence_number: i32,");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  poVar3 = std::operator<<((ostream *)poVar1,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<((ostream *)poVar1,"impl ");
  poVar3 = std::operator<<(poVar3,(string *)&SYNC_CLIENT_GENERIC_BOUND_VARS_abi_cxx11_);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,(string *)client_impl_name);
  poVar3 = std::operator<<(poVar3,(string *)&SYNC_CLIENT_GENERIC_BOUND_VARS_abi_cxx11_);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,(string *)&SYNC_CLIENT_GENERIC_BOUNDS_abi_cxx11_);
  poVar3 = std::operator<<(poVar3," {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  render_sync_client_lifecycle_functions(this,client_impl_name);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  poVar3 = std::operator<<((ostream *)poVar1,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_rs_generator::render_sync_client_definition_and_impl(const string& client_impl_name) {

  // render the definition for the client struct
  f_gen_
    << "pub struct "
    << client_impl_name
    << SYNC_CLIENT_GENERIC_BOUND_VARS
    << " "
    << SYNC_CLIENT_GENERIC_BOUNDS
    << " {"
    << endl;
  indent_up();
  f_gen_ << indent() << "_i_prot: IP," << endl;
  f_gen_ << indent() << "_o_prot: OP," << endl;
  f_gen_ << indent() << "_sequence_number: i32," << endl;
  indent_down();
  f_gen_ << "}" << endl;
  f_gen_ << endl;

  // render the struct implementation
  // this includes the new() function as well as the helper send/recv methods for each service call
  f_gen_
    << "impl "
    << SYNC_CLIENT_GENERIC_BOUND_VARS
    << " "
    << client_impl_name
    << SYNC_CLIENT_GENERIC_BOUND_VARS
    << " "
    << SYNC_CLIENT_GENERIC_BOUNDS
    << " {"
    << endl;
  indent_up();
  render_sync_client_lifecycle_functions(client_impl_name);
  indent_down();
  f_gen_ << "}" << endl;
  f_gen_ << endl;
}